

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digest.cpp
# Opt level: O1

void __thiscall jbcoin::openssl_sha512_hasher::openssl_sha512_hasher(openssl_sha512_hasher *this)

{
  SHA512_Init((SHA512_CTX *)this);
  return;
}

Assistant:

openssl_sha512_hasher::openssl_sha512_hasher()
{
    static_assert(sizeof(decltype(
        openssl_sha512_hasher::ctx_)) ==
            sizeof(SHA512_CTX), "");
    auto const ctx = reinterpret_cast<
        SHA512_CTX*>(ctx_);
    SHA512_Init(ctx);
}